

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int neverbleed_load_private_key_file(neverbleed_t *nb,SSL_CTX *ctx,char *fn,char *errbuf)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  st_neverbleed_thread_data_t *psVar4;
  size_t sVar5;
  void *pvVar6;
  BIGNUM *group;
  RSA *r;
  EVP_PKEY *pkey;
  BIGNUM *pBVar7;
  EC_POINT *pub;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  size_t *psVar11;
  int __fd;
  size_t __n;
  BIGNUM *pBVar12;
  char *pcVar13;
  char **str;
  long lVar14;
  BIGNUM *str_00;
  BIGNUM *e;
  long lStack_d8;
  iovec iStack_d0;
  BIGNUM *pBStack_c0;
  long lStack_b8;
  char *pcStack_b0;
  char **ppcStack_a8;
  size_t sStack_a0;
  RSA *pRStack_98;
  BIGNUM *pBStack_90;
  BIGNUM *local_80;
  char *local_78;
  neverbleed_t *local_70;
  BIGNUM *local_68;
  SSL_CTX *local_60;
  expbuf_t local_58;
  
  pBStack_90 = (BIGNUM *)0x188436;
  local_78 = errbuf;
  local_70 = nb;
  local_60 = (SSL_CTX *)ctx;
  psVar4 = get_thread_data(nb);
  local_58.end = (char *)0x0;
  local_58.capacity = 0;
  local_58.buf = (char *)0x0;
  local_58.start = (char *)0x0;
  pBStack_90 = (BIGNUM *)0x188456;
  expbuf_reserve(&local_58,9);
  builtin_strncpy(local_58.end,"load_key",9);
  local_58.end = local_58.end + 9;
  pBStack_90 = (BIGNUM *)0x18847b;
  sVar5 = strlen(fn);
  pBStack_90 = (BIGNUM *)0x18848d;
  expbuf_reserve(&local_58,sVar5 + 1);
  r = (RSA *)local_58.end;
  pBStack_90 = (BIGNUM *)0x18849f;
  memcpy(local_58.end,fn,sVar5 + 1);
  local_58.end = (char *)((long)&r->pad + sVar5 + 1);
  pBStack_90 = (BIGNUM *)0x1884b8;
  iVar3 = expbuf_write((expbuf_t *)local_58.start,(int)local_58.end);
  if (iVar3 == 0) {
    pBStack_90 = (BIGNUM *)0x1884cd;
    expbuf_dispose(&local_58);
    pBStack_90 = (BIGNUM *)0x1884da;
    iVar3 = expbuf_read(&local_58,psVar4->fd);
    pcVar13 = local_58.end;
    if (iVar3 == 0) {
      if (((ulong)((long)local_58.end - (long)local_58.start) < 8) ||
         (((long)local_58.end - (long)local_58.start) - 8U < 8)) goto LAB_001887a6;
      pcVar1 = *(char **)((long)local_58.start + 8);
      str = (char **)((long)local_58.start + 0x10);
      __n = (long)local_58.end - (long)str;
      if (*(char **)local_58.start == (char *)0x2) {
        if (7 < __n) {
          str = *(char ***)((long)local_58.start + 0x10);
          str_00 = (BIGNUM *)((long)local_58.start + 0x18);
          group = (BIGNUM *)(local_58.end + -(long)str_00);
          pBVar12 = (BIGNUM *)0x0;
          pBStack_90 = (BIGNUM *)0x18863e;
          pvVar6 = memchr(str_00,0,(size_t)group);
          if (pvVar6 != (void *)0x0) {
            local_58.start = (char *)((long)pvVar6 + 1);
            local_80 = (BIGNUM *)0x0;
            pBStack_90 = (BIGNUM *)0x188662;
            pBVar7 = (BIGNUM *)malloc(0x10);
            if (pBVar7 == (BIGNUM *)0x0) {
LAB_001887f8:
              pBStack_90 = (BIGNUM *)0x1887fd;
              neverbleed_load_private_key_file_cold_4();
LAB_001887fd:
              pBStack_90 = (BIGNUM *)0x188805;
              neverbleed_load_private_key_file_cold_6();
              pBVar7 = group;
LAB_00188805:
              group = pBVar7;
              pBStack_90 = (BIGNUM *)0x18880a;
              neverbleed_load_private_key_file_cold_3();
              goto LAB_0018880a;
            }
            pBVar7->d = (ulong *)local_70;
            *(char **)&pBVar7->top = pcVar1;
            pBStack_90 = (BIGNUM *)0x188683;
            r = (RSA *)EC_KEY_new_method(local_70->engine);
            pBVar12 = (BIGNUM *)0x0;
            pBStack_90 = (BIGNUM *)0x188693;
            EC_KEY_set_ex_data(r,0,pBVar7);
            pBStack_90 = (BIGNUM *)0x18869b;
            group = (BIGNUM *)EC_GROUP_new_by_curve_name((int)str);
            if (group == (BIGNUM *)0x0) goto LAB_00188805;
            pBStack_90 = (BIGNUM *)0x1886b2;
            EC_KEY_set_group((EC_KEY *)r,(EC_GROUP *)group);
            pBStack_90 = (BIGNUM *)0x1886bf;
            pBVar12 = str_00;
            iVar3 = BN_hex2bn(&local_80,(char *)str_00);
            if (iVar3 != 0) {
              pBStack_90 = (BIGNUM *)0x1886d8;
              pBVar12 = local_80;
              str_00 = group;
              pub = EC_POINT_bn2point((EC_GROUP *)group,local_80,(EC_POINT *)0x0,(BN_CTX *)0x0);
              if (pub != (EC_POINT *)0x0) {
                pBStack_90 = (BIGNUM *)0x1886ef;
                EC_KEY_set_public_key((EC_KEY *)r,pub);
                pBStack_90 = (BIGNUM *)0x1886f4;
                pkey = EVP_PKEY_new();
                pBStack_90 = (BIGNUM *)0x188702;
                EVP_PKEY_set1_EC_KEY(pkey,(ec_key_st *)r);
                pBStack_90 = (BIGNUM *)0x18870a;
                EC_POINT_free(pub);
                pBStack_90 = (BIGNUM *)0x188714;
                BN_free(local_80);
                pBStack_90 = (BIGNUM *)0x18871c;
                EC_GROUP_free((EC_GROUP *)group);
                pBStack_90 = (BIGNUM *)0x188724;
                EC_KEY_free((EC_KEY *)r);
                goto LAB_00188724;
              }
              goto LAB_0018881a;
            }
LAB_00188812:
            pBStack_90 = (BIGNUM *)0x18881a;
            neverbleed_load_private_key_file_cold_2();
LAB_0018881a:
            pBStack_90 = (BIGNUM *)expbuf_write;
            neverbleed_load_private_key_file_cold_1();
            lStack_d8 = (long)pBVar12 - (long)str_00;
            iStack_d0.iov_base = &lStack_d8;
            iStack_d0.iov_len = 8;
            lVar10 = 0;
            lVar14 = 0;
            pBStack_c0 = str_00;
            lStack_b8 = lStack_d8;
            pcStack_b0 = pcVar1;
            ppcStack_a8 = str;
            sStack_a0 = sVar5;
            pRStack_98 = r;
            pBStack_90 = group;
            do {
              while (uVar8 = writev(__fd,&iStack_d0 + lVar10,2 - (int)lVar14),
                    uVar8 == 0xffffffffffffffff) {
                piVar9 = __errno_location();
                if (*piVar9 != 4) {
                  return -1;
                }
              }
              if (uVar8 == 0) {
                __assert_fail("r != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/neverbleed/neverbleed.c"
                              ,0xfc,"int expbuf_write(struct expbuf_t *, int)");
              }
              lVar14 = (long)(int)lVar14;
              psVar11 = &(&iStack_d0)[lVar14].iov_len;
              do {
                uVar2 = *psVar11;
                if (uVar8 < uVar2) {
                  ((iovec *)(psVar11 + -1))->iov_base =
                       (void *)((long)((iovec *)(psVar11 + -1))->iov_base + uVar8);
                  *psVar11 = uVar2 - uVar8;
                  break;
                }
                lVar14 = lVar14 + 1;
                psVar11 = psVar11 + 2;
                uVar8 = uVar8 - uVar2;
              } while (uVar8 != 0);
              lVar10 = (long)(int)lVar14;
              if ((int)lVar14 == 2) {
                return 0;
              }
            } while( true );
          }
        }
      }
      else if (*(char **)local_58.start == (char *)0x1) {
        pBStack_90 = (BIGNUM *)0x18853a;
        pvVar6 = memchr(str,0,__n);
        if (pvVar6 != (void *)0x0) {
          str_00 = (BIGNUM *)((long)pvVar6 + 1);
          pBVar12 = (BIGNUM *)0x0;
          pBStack_90 = (BIGNUM *)0x188559;
          pvVar6 = memchr(str_00,0,(size_t)(pcVar13 + -(long)str_00));
          if (pvVar6 != (void *)0x0) {
            local_58.start = (char *)((long)pvVar6 + 1);
            local_80 = (BIGNUM *)0x0;
            local_68 = (BIGNUM *)0x0;
            pBStack_90 = (BIGNUM *)0x188580;
            group = (BIGNUM *)malloc(0x10);
            if (group == (BIGNUM *)0x0) {
              pBStack_90 = (BIGNUM *)0x1887f8;
              neverbleed_load_private_key_file_cold_7();
              group = (BIGNUM *)(pcVar13 + -(long)str_00);
              goto LAB_001887f8;
            }
            group->d = (ulong *)local_70;
            *(char **)&group->top = pcVar1;
            pBStack_90 = (BIGNUM *)0x1885a1;
            r = RSA_new_method((ENGINE *)local_70->engine);
            pBStack_90 = (BIGNUM *)0x1885b1;
            RSA_set_ex_data(r,0,group);
            pBStack_90 = (BIGNUM *)0x1885be;
            pBVar12 = (BIGNUM *)str;
            iVar3 = BN_hex2bn(&local_80,(char *)str);
            if (iVar3 == 0) goto LAB_001887fd;
            pBStack_90 = (BIGNUM *)0x1885d3;
            pBVar12 = str_00;
            iVar3 = BN_hex2bn(&local_68,(char *)str_00);
            if (iVar3 != 0) {
              pBStack_90 = (BIGNUM *)0x1885ef;
              RSA_set0_key(r,local_68,local_80,0);
              pBStack_90 = (BIGNUM *)0x1885fc;
              RSA_set_flags(r,0x20);
              pBStack_90 = (BIGNUM *)0x188601;
              pkey = EVP_PKEY_new();
              pBStack_90 = (BIGNUM *)0x18860f;
              EVP_PKEY_set1_RSA(pkey,r);
              pBStack_90 = (BIGNUM *)0x188617;
              RSA_free(r);
LAB_00188724:
              pBStack_90 = (BIGNUM *)0x18872e;
              expbuf_dispose(&local_58);
              pBStack_90 = (BIGNUM *)0x18873b;
              iVar3 = SSL_CTX_use_PrivateKey(local_60,pkey);
              if (iVar3 != 1) {
                builtin_strncpy(local_78,"SSL_CTX_use_PrivateKey failed",0x1e);
              }
              pBStack_90 = (BIGNUM *)0x188769;
              EVP_PKEY_free(pkey);
              return (uint)(iVar3 == 1);
            }
LAB_0018880a:
            pBStack_90 = (BIGNUM *)0x188812;
            neverbleed_load_private_key_file_cold_5();
            goto LAB_00188812;
          }
        }
      }
      else {
        pBStack_90 = (BIGNUM *)0x188770;
        pvVar6 = memchr(str,0,__n);
        if (pvVar6 != (void *)0x0) {
          pBStack_90 = (BIGNUM *)0x188790;
          snprintf(local_78,0x100,"%s",str);
          return -1;
        }
      }
LAB_001887a6:
      pBStack_90 = (BIGNUM *)0x1887ab;
      piVar9 = __errno_location();
      *piVar9 = 0;
      pcVar13 = "failed to parse response";
      goto LAB_001887ec;
    }
    pBStack_90 = (BIGNUM *)0x1887d7;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    pcVar13 = "read error";
  }
  else {
    pBStack_90 = (BIGNUM *)0x1887bf;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    pcVar13 = "write error";
  }
  if (iVar3 == 0) {
    pcVar13 = "connection closed by daemon";
  }
LAB_001887ec:
  pBStack_90 = (BIGNUM *)0x1887f3;
  dief(pcVar13);
}

Assistant:

int neverbleed_load_private_key_file(neverbleed_t *nb, SSL_CTX *ctx, const char *fn, char *errbuf)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    int ret = 1;
    size_t index, type;
    EVP_PKEY *pkey;

    expbuf_push_str(&buf, "load_key");
    expbuf_push_str(&buf, fn);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &type) != 0 || expbuf_shift_num(&buf, &index) != 0) {
        errno = 0;
        dief("failed to parse response");
    }

    switch (type) {
    case NEVERBLEED_TYPE_RSA: {
        char *estr, *nstr;

        if ((estr = expbuf_shift_str(&buf)) == NULL || (nstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = create_pkey(nb, index, estr, nstr);
        break;
    }
#if OPENSSL_1_1_API
    case NEVERBLEED_TYPE_ECDSA: {
        char *ec_pubkeystr;
        size_t curve_name;

        if (expbuf_shift_num(&buf, &curve_name) != 0 || (ec_pubkeystr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = ecdsa_create_pkey(nb, index, curve_name, ec_pubkeystr);
        break;
    }
#endif
    default: {
        char *errstr;

        if ((errstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }

        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "%s", errstr);
        return -1;
    }
    }

    expbuf_dispose(&buf);

    /* success */
    if (SSL_CTX_use_PrivateKey(ctx, pkey) != 1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "SSL_CTX_use_PrivateKey failed");
        ret = 0;
    }

    EVP_PKEY_free(pkey);
    return ret;
}